

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

char * addpackagedir(char *dir)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  packagedir *ppVar5;
  size_t sVar6;
  char *pcVar7;
  string pdir;
  char local_138 [259];
  undefined1 local_35;
  
  strncpy(local_138,dir,0x104);
  local_35 = 0;
  bVar1 = subhomedir(local_138,0x104,dir);
  if ((bVar1) && (sVar3 = fixpackagedir(local_138), sVar3 != 0)) {
    for (pcVar4 = strstr(local_138,"packages");
        (bVar1 = pcVar4 != (char *)0x0, bVar1 &&
        (((pcVar4 <= local_138 || (pcVar4[-1] != '/')) || (pcVar4[8] != '/'))));
        pcVar4 = strstr(pcVar4 + 8,"packages")) {
    }
    ppVar5 = vector<packagedir>::add(&packagedirs);
    if (bVar1) {
      sVar6 = (long)pcVar4 - (long)local_138;
    }
    else {
      sVar6 = strlen(local_138);
    }
    pcVar7 = (char *)operator_new__(sVar6 + 1);
    strncpy(pcVar7,local_138,sVar6 + 1);
    pcVar7[sVar6] = '\0';
    ppVar5->dir = pcVar7;
    if (bVar1) {
      iVar2 = (int)pcVar4 - (int)local_138;
    }
    else {
      sVar6 = strlen(local_138);
      iVar2 = (int)sVar6;
    }
    ppVar5->dirlen = iVar2;
    if (bVar1) {
      sVar6 = strlen(pcVar4);
      pcVar7 = (char *)operator_new__(sVar6 + 1);
      strncpy(pcVar7,pcVar4,sVar6 + 1);
      pcVar7[sVar6] = '\0';
      ppVar5->filter = pcVar7;
      sVar6 = strlen(pcVar4);
      iVar2 = (int)sVar6;
    }
    else {
      ppVar5->filter = (char *)0x0;
      iVar2 = 0;
    }
    ppVar5->filterlen = iVar2;
    pcVar4 = ppVar5->dir;
  }
  else {
    pcVar4 = (char *)0x0;
  }
  return pcVar4;
}

Assistant:

const char *addpackagedir(const char *dir)
{
    string pdir;
    copystring(pdir, dir);
    if(!subhomedir(pdir, sizeof(pdir), dir) || !fixpackagedir(pdir)) return NULL;
    char *filter = pdir;
    for(;;)
    {
        static int len = strlen("packages");
        filter = strstr(filter, "packages");
        if(!filter) break;
        if(filter > pdir && filter[-1] == PATHDIV && filter[len] == PATHDIV) break;
        filter += len;
    }
    packagedir &pf = packagedirs.add();
    pf.dir = filter ? newstring(pdir, filter-pdir) : newstring(pdir);
    pf.dirlen = filter ? filter-pdir : strlen(pdir);
    pf.filter = filter ? newstring(filter) : NULL;
    pf.filterlen = filter ? strlen(filter) : 0;
    return pf.dir;
}